

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

int input_nnybble(uchar *infile,int n,uchar *array)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  
  if (n == 1) {
    iVar2 = input_nybble(infile);
    *array = (uchar)iVar2;
    return iVar2;
  }
  if (bits_to_go == 8) {
    nextchar = nextchar + -1;
    bits_to_go = 0;
  }
  pbVar3 = (byte *)(ulong)(uint)bits_to_go;
  iVar2 = n / 2;
  if (bits_to_go == 0) {
    if (n < 2) goto LAB_0017a981;
    pbVar3 = array + 1;
    iVar5 = iVar2;
    do {
      bVar1 = infile[nextchar];
      buffer2 = buffer2 << 8 | (uint)bVar1;
      nextchar = nextchar + 1;
      pbVar3[-1] = bVar1 >> 4;
      *pbVar3 = bVar1 & 0xf;
      pbVar3 = pbVar3 + 2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  else {
    if (n < 2) {
LAB_0017a981:
      iVar2 = 0;
      iVar5 = bits_to_go;
      goto LAB_0017a983;
    }
    bVar1 = (byte)bits_to_go;
    pbVar4 = array + 1;
    iVar5 = iVar2;
    do {
      buffer2 = buffer2 << 8 | (uint)infile[nextchar];
      nextchar = nextchar + 1;
      pbVar4[-1] = (byte)(buffer2 >> (bVar1 + 4 & 0x1f)) & 0xf;
      *pbVar4 = (byte)(buffer2 >> (bVar1 & 0x1f)) & 0xf;
      pbVar4 = pbVar4 + 2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  iVar2 = iVar2 * 2;
  iVar5 = (int)pbVar3;
LAB_0017a983:
  if (iVar2 != n) {
    iVar5 = input_nybble(infile);
    array[(long)n + -1] = (uchar)iVar5;
  }
  return iVar5;
}

Assistant:

static int input_nnybble(unsigned char *infile, int n, unsigned char array[])
{
	/* copy n 4-bit nybbles from infile to the lower 4 bits of array */

int ii, kk, shift1, shift2;

/*  forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go != 8) input_nbits(infile, bits_to_go);
*/
	if (n == 1) {
		array[0] = input_nybble(infile);
		return(0);
	}
	
	if (bits_to_go == 8) {
		/*
		   already have 2 full nybbles in buffer2, so 
		   backspace the infile array to reuse last char
		*/
		nextchar--;
		bits_to_go = 0;
	}
	
	/* bits_to_go now has a value in the range 0 - 7.  After adding  */
	/* another byte, bits_to_go effectively will be in range 8 - 15 */	

	shift1 = bits_to_go + 4;   /* shift1 will be in range 4 - 11 */
	shift2 = bits_to_go;	   /* shift2 will be in range 0 -  7 */
	kk = 0;

	/* special case */
	if (bits_to_go == 0) 
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>4) & 15);
		array[kk + 1] = (int) ((buffer2) & 15);    /* no shift required */
		kk += 2;
	    }
	}
	else
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>shift1) & 15);
		array[kk + 1] = (int) ((buffer2>>shift2) & 15);
		kk += 2;
	    }
	}


	if (ii * 2 != n) {  /* have to read last odd byte */
		array[n-1] = input_nybble(infile);
	}

	return( (buffer2>>bits_to_go) & 15 ); 
}